

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

TRef sload(jit_State *J,int32_t slot)

{
  uint uVar1;
  BCReg BVar2;
  TRef TVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = *(uint *)((long)J->L->base + (long)slot * 8 + 4);
  uVar4 = 3;
  if ((uVar1 & 0xffff8000) != 0xffff0000) {
    uVar4 = ~uVar1;
  }
  uVar5 = 0xe;
  if (0xfffefffe < uVar1) {
    uVar5 = uVar4;
  }
  BVar2 = J->baseslot;
  (J->fold).ins.field_0.ot = (ushort)uVar5 | 0x4680;
  (J->fold).ins.field_0.op1 = (short)BVar2 + (short)slot;
  (J->fold).ins.field_0.op2 = 4;
  TVar3 = lj_ir_emit(J);
  if (uVar5 < 3) {
    TVar3 = uVar5 * 0xffffff + 0x7fff;
  }
  J->base[slot] = TVar3;
  return TVar3;
}

Assistant:

static TRef sload(jit_State *J, int32_t slot)
{
  IRType t = itype2irt(&J->L->base[slot]);
  TRef ref = emitir_raw(IRTG(IR_SLOAD, t), (int32_t)J->baseslot+slot,
			IRSLOAD_TYPECHECK);
  if (irtype_ispri(t)) ref = TREF_PRI(t);  /* Canonicalize primitive refs. */
  J->base[slot] = ref;
  return ref;
}